

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sparse.array.c
# Opt level: O0

void pnga_sprs_array_shift_diag(Integer s_a,void *shift)

{
  float fVar1;
  double dVar2;
  float fVar3;
  int iVar4;
  int iVar5;
  Integer IVar6;
  long lVar7;
  double dVar8;
  long lVar9;
  int iVar10;
  long lVar11;
  Integer IVar12;
  long lVar13;
  double *in_RSI;
  long in_RDI;
  double *_vptr_13;
  double _ishift_3;
  double _rshift_3;
  float *_vptr_12;
  float _ishift_2;
  float _rshift_2;
  double *_vptr_11;
  double _shift_9;
  float *_vptr_10;
  float _shift_8;
  longlong *_vptr_9;
  longlong _shift_7;
  long *_vptr_8;
  long _shift_6;
  int *_vptr_7;
  int _shift_5;
  double *_vptr_6;
  double _ishift_1;
  double _rshift_1;
  float *_vptr_5;
  float _ishift;
  float _rshift;
  double *_vptr_4;
  double _shift_4;
  float *_vptr_3;
  float _shift_3;
  longlong *_vptr_2;
  longlong _shift_2;
  long *_vptr_1;
  long _shift_1;
  int *_vptr;
  int _shift;
  void *vptr;
  int64_t *jlptr;
  int64_t *ilptr;
  int *jptr;
  int *iptr;
  int idx_size;
  Integer type;
  Integer ncols;
  Integer iproc;
  Integer j;
  Integer i;
  Integer ihi;
  Integer ilo;
  Integer nproc;
  Integer me;
  Integer grp;
  int local_sync_end;
  int local_sync_begin;
  Integer hdl;
  void *in_stack_fffffffffffffe70;
  Integer *in_stack_fffffffffffffe88;
  undefined4 in_stack_fffffffffffffe90;
  undefined4 in_stack_fffffffffffffe94;
  Integer in_stack_fffffffffffffe98;
  Integer in_stack_fffffffffffffea0;
  undefined4 in_stack_fffffffffffffee0;
  float in_stack_fffffffffffffee4;
  void *in_stack_fffffffffffffee8;
  void *in_stack_fffffffffffffef0;
  double in_stack_fffffffffffffef8;
  void *in_stack_ffffffffffffff00;
  void *local_a0;
  long local_98;
  long local_90;
  long local_88;
  long local_80;
  long local_60;
  long local_58;
  long local_50;
  long local_48;
  long local_40;
  
  lVar11 = in_RDI + 1000;
  IVar6 = SPA[lVar11].grp;
  pnga_pgroup_nodeid(IVar6);
  IVar12 = pnga_pgroup_nnodes(IVar6);
  iVar10 = _ga_sync_end;
  iVar4 = _ga_sync_begin;
  lVar7 = SPA[lVar11].type;
  IVar6 = SPA[lVar11].idx_size;
  _ga_sync_begin = 1;
  _ga_sync_end = 1;
  if (iVar4 != 0) {
    pnga_pgroup_sync((Integer)in_stack_fffffffffffffe70);
  }
  pnga_sprs_array_row_distribution
            (in_stack_fffffffffffffea0,in_stack_fffffffffffffe98,
             (Integer *)CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90),
             in_stack_fffffffffffffe88);
  for (local_60 = 0; local_60 < IVar12; local_60 = local_60 + 1) {
    if ((int)IVar6 == 4) {
      pnga_sprs_array_access_col_block
                ((Integer)in_stack_ffffffffffffff00,(Integer)in_stack_fffffffffffffef8,
                 in_stack_fffffffffffffef0,in_stack_fffffffffffffee8,
                 (void *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0));
      if (local_a0 != (void *)0x0) {
        if (lVar7 == 0x3e9) {
          fVar3 = *(float *)in_RSI;
          for (local_50 = local_40; local_50 <= local_48; local_50 = local_50 + 1) {
            iVar4 = *(int *)(local_80 + ((local_50 + 1) - local_40) * 4);
            iVar5 = *(int *)(local_80 + (local_50 - local_40) * 4);
            for (local_58 = 0; local_58 < iVar4 - iVar5; local_58 = local_58 + 1) {
              if (local_50 ==
                  *(int *)(local_88 +
                          (*(int *)(local_80 + (local_50 - local_40) * 4) + local_58) * 4)) {
                lVar11 = *(int *)(local_80 + (local_50 - local_40) * 4) + local_58;
                *(int *)((long)local_a0 + lVar11 * 4) =
                     (int)fVar3 + *(int *)((long)local_a0 + lVar11 * 4);
              }
            }
          }
        }
        else if (lVar7 == 0x3ea) {
          dVar8 = *in_RSI;
          for (local_50 = local_40; local_50 <= local_48; local_50 = local_50 + 1) {
            iVar4 = *(int *)(local_80 + ((local_50 + 1) - local_40) * 4);
            iVar5 = *(int *)(local_80 + (local_50 - local_40) * 4);
            for (local_58 = 0; local_58 < iVar4 - iVar5; local_58 = local_58 + 1) {
              if (local_50 ==
                  *(int *)(local_88 +
                          (*(int *)(local_80 + (local_50 - local_40) * 4) + local_58) * 4)) {
                lVar11 = *(int *)(local_80 + (local_50 - local_40) * 4) + local_58;
                *(long *)((long)local_a0 + lVar11 * 8) =
                     (long)dVar8 + *(long *)((long)local_a0 + lVar11 * 8);
              }
            }
          }
        }
        else if (lVar7 == 0x3f8) {
          dVar8 = *in_RSI;
          for (local_50 = local_40; local_50 <= local_48; local_50 = local_50 + 1) {
            iVar4 = *(int *)(local_80 + ((local_50 + 1) - local_40) * 4);
            iVar5 = *(int *)(local_80 + (local_50 - local_40) * 4);
            for (local_58 = 0; local_58 < iVar4 - iVar5; local_58 = local_58 + 1) {
              if (local_50 ==
                  *(int *)(local_88 +
                          (*(int *)(local_80 + (local_50 - local_40) * 4) + local_58) * 4)) {
                lVar11 = *(int *)(local_80 + (local_50 - local_40) * 4) + local_58;
                *(long *)((long)local_a0 + lVar11 * 8) =
                     (long)dVar8 + *(long *)((long)local_a0 + lVar11 * 8);
              }
            }
          }
        }
        else if (lVar7 == 0x3eb) {
          fVar3 = *(float *)in_RSI;
          for (local_50 = local_40; local_50 <= local_48; local_50 = local_50 + 1) {
            iVar4 = *(int *)(local_80 + ((local_50 + 1) - local_40) * 4);
            iVar5 = *(int *)(local_80 + (local_50 - local_40) * 4);
            for (local_58 = 0; local_58 < iVar4 - iVar5; local_58 = local_58 + 1) {
              if (local_50 ==
                  *(int *)(local_88 +
                          (*(int *)(local_80 + (local_50 - local_40) * 4) + local_58) * 4)) {
                lVar11 = *(int *)(local_80 + (local_50 - local_40) * 4) + local_58;
                *(float *)((long)local_a0 + lVar11 * 4) =
                     fVar3 + *(float *)((long)local_a0 + lVar11 * 4);
              }
            }
          }
        }
        else if (lVar7 == 0x3ec) {
          dVar8 = *in_RSI;
          for (local_50 = local_40; local_50 <= local_48; local_50 = local_50 + 1) {
            iVar4 = *(int *)(local_80 + ((local_50 + 1) - local_40) * 4);
            iVar5 = *(int *)(local_80 + (local_50 - local_40) * 4);
            for (local_58 = 0; local_58 < iVar4 - iVar5; local_58 = local_58 + 1) {
              if (local_50 ==
                  *(int *)(local_88 +
                          (*(int *)(local_80 + (local_50 - local_40) * 4) + local_58) * 4)) {
                lVar11 = *(int *)(local_80 + (local_50 - local_40) * 4) + local_58;
                *(double *)((long)local_a0 + lVar11 * 8) =
                     dVar8 + *(double *)((long)local_a0 + lVar11 * 8);
              }
            }
          }
        }
        else if (lVar7 == 0x3ee) {
          fVar3 = *(float *)in_RSI;
          fVar1 = *(float *)((long)in_RSI + 4);
          for (local_50 = local_40; in_stack_ffffffffffffff00 = local_a0, local_50 <= local_48;
              local_50 = local_50 + 1) {
            iVar4 = *(int *)(local_80 + ((local_50 + 1) - local_40) * 4);
            iVar5 = *(int *)(local_80 + (local_50 - local_40) * 4);
            for (local_58 = 0; local_58 < iVar4 - iVar5; local_58 = local_58 + 1) {
              if (local_50 ==
                  *(int *)(local_88 +
                          (*(int *)(local_80 + (local_50 - local_40) * 4) + local_58) * 4)) {
                lVar11 = *(int *)(local_80 + (local_50 - local_40) * 4) + local_58;
                *(float *)((long)local_a0 + lVar11 * 8) =
                     fVar3 + *(float *)((long)local_a0 + lVar11 * 8);
                lVar11 = *(int *)(local_80 + (local_50 - local_40) * 4) + local_58;
                *(float *)((long)local_a0 + lVar11 * 8 + 4) =
                     fVar1 + *(float *)((long)local_a0 + lVar11 * 8 + 4);
              }
            }
          }
        }
        else if (lVar7 == 0x3ef) {
          in_stack_fffffffffffffef8 = *in_RSI;
          in_stack_fffffffffffffef0 = (void *)in_RSI[1];
          for (local_50 = local_40; in_stack_fffffffffffffee8 = local_a0, local_50 <= local_48;
              local_50 = local_50 + 1) {
            iVar4 = *(int *)(local_80 + ((local_50 + 1) - local_40) * 4);
            iVar5 = *(int *)(local_80 + (local_50 - local_40) * 4);
            for (local_58 = 0; local_58 < iVar4 - iVar5; local_58 = local_58 + 1) {
              if (local_50 ==
                  *(int *)(local_88 +
                          (*(int *)(local_80 + (local_50 - local_40) * 4) + local_58) * 4)) {
                lVar11 = *(int *)(local_80 + (local_50 - local_40) * 4) + local_58;
                *(double *)((long)local_a0 + lVar11 * 0x10) =
                     in_stack_fffffffffffffef8 + *(double *)((long)local_a0 + lVar11 * 0x10);
                lVar11 = *(int *)(local_80 + (local_50 - local_40) * 4) + local_58;
                *(double *)((long)local_a0 + lVar11 * 0x10 + 8) =
                     (double)in_stack_fffffffffffffef0 +
                     *(double *)((long)local_a0 + lVar11 * 0x10 + 8);
              }
            }
          }
        }
      }
    }
    else {
      pnga_sprs_array_access_col_block
                ((Integer)in_stack_ffffffffffffff00,(Integer)in_stack_fffffffffffffef8,
                 in_stack_fffffffffffffef0,in_stack_fffffffffffffee8,
                 (void *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0));
      if (local_a0 != (void *)0x0) {
        if (lVar7 == 0x3e9) {
          in_stack_fffffffffffffee4 = *(float *)in_RSI;
          for (local_50 = local_40; local_50 <= local_48; local_50 = local_50 + 1) {
            lVar11 = *(long *)(local_90 + ((local_50 + 1) - local_40) * 8);
            lVar9 = *(long *)(local_90 + (local_50 - local_40) * 8);
            for (local_58 = 0; local_58 < lVar11 - lVar9; local_58 = local_58 + 1) {
              if (local_50 ==
                  *(long *)(local_98 +
                           (*(long *)(local_90 + (local_50 - local_40) * 8) + local_58) * 8)) {
                lVar13 = *(long *)(local_90 + (local_50 - local_40) * 8) + local_58;
                *(int *)((long)local_a0 + lVar13 * 4) =
                     (int)in_stack_fffffffffffffee4 + *(int *)((long)local_a0 + lVar13 * 4);
              }
            }
          }
        }
        else if (lVar7 == 0x3ea) {
          dVar8 = *in_RSI;
          for (local_50 = local_40; local_50 <= local_48; local_50 = local_50 + 1) {
            lVar11 = *(long *)(local_90 + ((local_50 + 1) - local_40) * 8);
            lVar9 = *(long *)(local_90 + (local_50 - local_40) * 8);
            for (local_58 = 0; local_58 < lVar11 - lVar9; local_58 = local_58 + 1) {
              if (local_50 ==
                  *(long *)(local_98 +
                           (*(long *)(local_90 + (local_50 - local_40) * 8) + local_58) * 8)) {
                lVar13 = *(long *)(local_90 + (local_50 - local_40) * 8) + local_58;
                *(long *)((long)local_a0 + lVar13 * 8) =
                     (long)dVar8 + *(long *)((long)local_a0 + lVar13 * 8);
              }
            }
          }
        }
        else if (lVar7 == 0x3f8) {
          dVar8 = *in_RSI;
          for (local_50 = local_40; local_50 <= local_48; local_50 = local_50 + 1) {
            lVar11 = *(long *)(local_90 + ((local_50 + 1) - local_40) * 8);
            lVar9 = *(long *)(local_90 + (local_50 - local_40) * 8);
            for (local_58 = 0; local_58 < lVar11 - lVar9; local_58 = local_58 + 1) {
              if (local_50 ==
                  *(long *)(local_98 +
                           (*(long *)(local_90 + (local_50 - local_40) * 8) + local_58) * 8)) {
                lVar13 = *(long *)(local_90 + (local_50 - local_40) * 8) + local_58;
                *(long *)((long)local_a0 + lVar13 * 8) =
                     (long)dVar8 + *(long *)((long)local_a0 + lVar13 * 8);
              }
            }
          }
        }
        else if (lVar7 == 0x3eb) {
          fVar3 = *(float *)in_RSI;
          for (local_50 = local_40; local_50 <= local_48; local_50 = local_50 + 1) {
            lVar11 = *(long *)(local_90 + ((local_50 + 1) - local_40) * 8);
            lVar9 = *(long *)(local_90 + (local_50 - local_40) * 8);
            for (local_58 = 0; local_58 < lVar11 - lVar9; local_58 = local_58 + 1) {
              if (local_50 ==
                  *(long *)(local_98 +
                           (*(long *)(local_90 + (local_50 - local_40) * 8) + local_58) * 8)) {
                lVar13 = *(long *)(local_90 + (local_50 - local_40) * 8) + local_58;
                *(float *)((long)local_a0 + lVar13 * 4) =
                     fVar3 + *(float *)((long)local_a0 + lVar13 * 4);
              }
            }
          }
        }
        else if (lVar7 == 0x3ec) {
          dVar8 = *in_RSI;
          for (local_50 = local_40; local_50 <= local_48; local_50 = local_50 + 1) {
            lVar11 = *(long *)(local_90 + ((local_50 + 1) - local_40) * 8);
            lVar9 = *(long *)(local_90 + (local_50 - local_40) * 8);
            for (local_58 = 0; local_58 < lVar11 - lVar9; local_58 = local_58 + 1) {
              if (local_50 ==
                  *(long *)(local_98 +
                           (*(long *)(local_90 + (local_50 - local_40) * 8) + local_58) * 8)) {
                lVar13 = *(long *)(local_90 + (local_50 - local_40) * 8) + local_58;
                *(double *)((long)local_a0 + lVar13 * 8) =
                     dVar8 + *(double *)((long)local_a0 + lVar13 * 8);
              }
            }
          }
        }
        else if (lVar7 == 0x3ee) {
          fVar3 = *(float *)in_RSI;
          fVar1 = *(float *)((long)in_RSI + 4);
          for (local_50 = local_40; local_50 <= local_48; local_50 = local_50 + 1) {
            lVar11 = *(long *)(local_90 + ((local_50 + 1) - local_40) * 8);
            lVar9 = *(long *)(local_90 + (local_50 - local_40) * 8);
            for (local_58 = 0; local_58 < lVar11 - lVar9; local_58 = local_58 + 1) {
              if (local_50 ==
                  *(long *)(local_98 +
                           (*(long *)(local_90 + (local_50 - local_40) * 8) + local_58) * 8)) {
                lVar13 = *(long *)(local_90 + (local_50 - local_40) * 8) + local_58;
                *(float *)((long)local_a0 + lVar13 * 8) =
                     fVar3 + *(float *)((long)local_a0 + lVar13 * 8);
                lVar13 = *(long *)(local_90 + (local_50 - local_40) * 8) + local_58;
                *(float *)((long)local_a0 + lVar13 * 8 + 4) =
                     fVar1 + *(float *)((long)local_a0 + lVar13 * 8 + 4);
              }
            }
          }
        }
        else if (lVar7 == 0x3ef) {
          dVar8 = *in_RSI;
          dVar2 = in_RSI[1];
          for (local_50 = local_40; in_stack_fffffffffffffe70 = local_a0, local_50 <= local_48;
              local_50 = local_50 + 1) {
            lVar11 = *(long *)(local_90 + ((local_50 + 1) - local_40) * 8);
            lVar9 = *(long *)(local_90 + (local_50 - local_40) * 8);
            for (local_58 = 0; local_58 < lVar11 - lVar9; local_58 = local_58 + 1) {
              if (local_50 ==
                  *(long *)(local_98 +
                           (*(long *)(local_90 + (local_50 - local_40) * 8) + local_58) * 8)) {
                lVar13 = *(long *)(local_90 + (local_50 - local_40) * 8) + local_58;
                *(double *)((long)local_a0 + lVar13 * 0x10) =
                     dVar8 + *(double *)((long)local_a0 + lVar13 * 0x10);
                lVar13 = *(long *)(local_90 + (local_50 - local_40) * 8) + local_58;
                *(double *)((long)local_a0 + lVar13 * 0x10 + 8) =
                     dVar2 + *(double *)((long)local_a0 + lVar13 * 0x10 + 8);
              }
            }
          }
        }
      }
    }
  }
  if (iVar10 != 0) {
    pnga_pgroup_sync((Integer)in_stack_fffffffffffffe70);
  }
  return;
}

Assistant:

void pnga_sprs_array_shift_diag(Integer s_a, void *shift)
{
  Integer hdl = GA_OFFSET + s_a;
  int local_sync_begin,local_sync_end;
  Integer grp = SPA[hdl].grp;
  Integer me = pnga_pgroup_nodeid(grp);
  Integer nproc = pnga_pgroup_nnodes(grp);
  Integer ilo, ihi;
  Integer i, j, iproc, ncols;
  Integer type = SPA[hdl].type;
  int idx_size = SPA[hdl].idx_size;
  int *iptr, *jptr;
  int64_t *ilptr, *jlptr;
  void *vptr;

  local_sync_begin = _ga_sync_begin; local_sync_end = _ga_sync_end;
  _ga_sync_begin = 1; _ga_sync_end=1; /*remove any previous masking*/
  if (local_sync_begin) pnga_pgroup_sync(grp);

  /* get block from diagonal array corresponding to this row block (there is
   * only one) */
  pnga_sprs_array_row_distribution(s_a,me,&ilo,&ihi);

#define SPRS_REAL_SHIFT_DIAG_M(_type,_iptr,_jptr)             \
  {                                                           \
    _type _shift = *((_type*)shift);                          \
    _type *_vptr = (_type*)vptr;                              \
    for (i=ilo; i<=ihi; i++) {                                \
      ncols = _iptr[i+1-ilo]-_iptr[i-ilo];                    \
      for (j=0; j<ncols; j++) {                               \
        if (i == _jptr[_iptr[i-ilo]+j]) {                     \
          _vptr[_iptr[i-ilo]+j] += _shift;                    \
        }                                                     \
      }                                                       \
    }                                                         \
  }                

#define SPRS_COMPLEX_SHIFT_DIAG_M(_type,_iptr,_jptr)          \
  {                                                           \
    _type _rshift = ((_type*)shift)[0];                       \
    _type _ishift = ((_type*)shift)[1];                       \
    _type *_vptr = (_type*)vptr;                              \
    for (i=ilo; i<=ihi; i++) {                                \
      ncols = _iptr[i+1-ilo]-_iptr[i-ilo];                    \
      for (j=0; j<ncols; j++) {                               \
        if (i == _jptr[_iptr[i-ilo]+j]) {                     \
          _vptr[2*(_iptr[i-ilo]+j)] += _rshift;               \
          _vptr[2*(_iptr[i-ilo]+j)+1] += _ishift;             \
        }                                                     \
      }                                                       \
    }                                                         \
  }                

  /* loop over blocks in sparse array */
  for (iproc=0; iproc<nproc; iproc++) {
    if (idx_size == 4) {
      pnga_sprs_array_access_col_block(s_a,iproc,&iptr,&jptr,&vptr);
      if (vptr != NULL) {
        if (type == C_INT) {
          SPRS_REAL_SHIFT_DIAG_M(int,iptr,jptr);
        } else if (type == C_LONG) {
          SPRS_REAL_SHIFT_DIAG_M(long,iptr,jptr);
        } else if (type == C_LONGLONG) {
          SPRS_REAL_SHIFT_DIAG_M(long long,iptr,jptr);
        } else if (type == C_FLOAT) {
          SPRS_REAL_SHIFT_DIAG_M(float,iptr,jptr);
        } else if (type == C_DBL) {
          SPRS_REAL_SHIFT_DIAG_M(double,iptr,jptr);
        } else if (type == C_SCPL) {
          SPRS_COMPLEX_SHIFT_DIAG_M(float,iptr,jptr);
        } else if (type == C_DCPL) {
          SPRS_COMPLEX_SHIFT_DIAG_M(double,iptr,jptr);
        }
      }
    } else {
      pnga_sprs_array_access_col_block(s_a,iproc,&ilptr,&jlptr,&vptr);
      if (vptr != NULL) {
        if (type == C_INT) {
          SPRS_REAL_SHIFT_DIAG_M(int,ilptr,jlptr);
        } else if (type == C_LONG) {
          SPRS_REAL_SHIFT_DIAG_M(long,ilptr,jlptr);
        } else if (type == C_LONGLONG) {
          SPRS_REAL_SHIFT_DIAG_M(long long,ilptr,jlptr);
        } else if (type == C_FLOAT) {
          SPRS_REAL_SHIFT_DIAG_M(float,ilptr,jlptr);
        } else if (type == C_DBL) {
          SPRS_REAL_SHIFT_DIAG_M(double,ilptr,jlptr);
        } else if (type == C_SCPL) {
          SPRS_COMPLEX_SHIFT_DIAG_M(float,ilptr,jlptr);
        } else if (type == C_DCPL) {
          SPRS_COMPLEX_SHIFT_DIAG_M(double,ilptr,jlptr);
        }
      }
    }
  }

#undef SPRS_REAL_SHIFT_DIAG_M
#undef SPRS_COMPLEX_SHIFT_DIAG_M

  if (local_sync_end) pnga_pgroup_sync(grp);
}